

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O1

void * cmGetSource(void *arg,char *name)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmSourceFile *this;
  cmCPluginAPISourceFile *__s;
  _Rb_tree_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>
  _Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  pointer *__ptr;
  pair<std::_Rb_tree_iterator<std::pair<cmSourceFile_*const,_std::unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>_>_>,_bool>
  pVar5;
  __single_object sf;
  cmSourceFile *rsf;
  _Head_base<0UL,_cmCPluginAPISourceFile_*,_false> local_58;
  string local_50;
  cmSourceFile *local_30;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,name,(allocator<char> *)&local_58);
  this = cmMakefile::GetSource((cmMakefile *)arg,&local_50,Ambiguous);
  paVar1 = &local_50.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (this == (cmSourceFile *)0x0) {
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    p_Var3 = &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    if (cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent !=
        (_Base_ptr)0x0) {
      p_Var3 = &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var4 = cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      do {
        if (*(cmSourceFile **)(p_Var4 + 1) >= this) {
          p_Var3 = p_Var4;
        }
        p_Var4 = (&p_Var4->_M_left)[*(cmSourceFile **)(p_Var4 + 1) < this];
      } while (p_Var4 != (_Base_ptr)0x0);
    }
    _Var2._M_node = &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header;
    if (((_Rb_tree_header *)p_Var3 != &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header)
       && (_Var2._M_node = &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header._M_header,
          *(cmSourceFile **)(p_Var3 + 1) <= this)) {
      _Var2._M_node = p_Var3;
    }
    if ((_Rb_tree_header *)_Var2._M_node ==
        &cmCPluginAPISourceFiles._M_t._M_impl.super__Rb_tree_header) {
      local_30 = this;
      __s = (cmCPluginAPISourceFile *)operator_new(0xb8);
      memset(__s,0,0xb8);
      (__s->SourceName)._M_dataplus._M_p = (pointer)&(__s->SourceName).field_2;
      (__s->SourceName)._M_string_length = 0;
      (__s->SourceName).field_2._M_local_buf[0] = '\0';
      (__s->SourceExtension)._M_dataplus._M_p = (pointer)&(__s->SourceExtension).field_2;
      (__s->SourceExtension)._M_string_length = 0;
      (__s->SourceExtension).field_2._M_local_buf[0] = '\0';
      (__s->FullPath)._M_dataplus._M_p = (pointer)&(__s->FullPath).field_2;
      (__s->FullPath)._M_string_length = 0;
      (__s->FullPath).field_2._M_local_buf[0] = '\0';
      (__s->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (__s->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (__s->Depends).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__s->Properties).Map_._M_h._M_buckets = &(__s->Properties).Map_._M_h._M_single_bucket;
      (__s->Properties).Map_._M_h._M_bucket_count = 1;
      (__s->Properties).Map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->Properties).Map_._M_h._M_element_count = 0;
      (__s->Properties).Map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__s->Properties).Map_._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->Properties).Map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      __s->RealSourceFile = this;
      local_58._M_head_impl = __s;
      cmSourceFile::ResolveFullPath(this,(string *)0x0,(string *)0x0);
      std::__cxx11::string::_M_assign((string *)&(local_58._M_head_impl)->FullPath);
      cmsys::SystemTools::GetFilenameWithoutLastExtension
                (&local_50,&(local_58._M_head_impl)->FullPath);
      std::__cxx11::string::operator=
                ((string *)&(local_58._M_head_impl)->SourceName,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::GetFilenameLastExtension(&local_50,&(local_58._M_head_impl)->FullPath);
      std::__cxx11::string::operator=
                ((string *)&(local_58._M_head_impl)->SourceExtension,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      pVar5 = std::
              _Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>,std::_Select1st<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
              ::
              _M_emplace_unique<cmSourceFile*&,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>
                        ((_Rb_tree<cmSourceFile*,std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>,std::_Select1st<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>,std::less<cmSourceFile*>,std::allocator<std::pair<cmSourceFile*const,std::unique_ptr<cmCPluginAPISourceFile,std::default_delete<cmCPluginAPISourceFile>>>>>
                          *)&cmCPluginAPISourceFiles,&local_30,
                         (unique_ptr<cmCPluginAPISourceFile,_std::default_delete<cmCPluginAPISourceFile>_>
                          *)&local_58);
      _Var2 = pVar5.first._M_node;
      if (local_58._M_head_impl != (cmCPluginAPISourceFile *)0x0) {
        std::default_delete<cmCPluginAPISourceFile>::operator()
                  ((default_delete<cmCPluginAPISourceFile> *)&local_58,local_58._M_head_impl);
      }
    }
    p_Var3 = _Var2._M_node[1]._M_parent;
  }
  return p_Var3;
}

Assistant:

static void CCONV* cmGetSource(void* arg, const char* name)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  if (cmSourceFile* rsf = mf->GetSource(name)) {
    // Lookup the proxy source file object for this source.
    auto i = cmCPluginAPISourceFiles.find(rsf);
    if (i == cmCPluginAPISourceFiles.end()) {
      // Create a proxy source file object for this source.
      auto sf = cm::make_unique<cmCPluginAPISourceFile>();
      sf->RealSourceFile = rsf;
      sf->FullPath = rsf->ResolveFullPath();
      sf->SourceName =
        cmSystemTools::GetFilenameWithoutLastExtension(sf->FullPath);
      sf->SourceExtension =
        cmSystemTools::GetFilenameLastExtension(sf->FullPath);

      // Store the proxy in the map so it can be reused and deleted later.
      i = cmCPluginAPISourceFiles.emplace(rsf, std::move(sf)).first;
    }
    return i->second.get();
  }
  return nullptr;
}